

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigInd.c
# Opt level: O2

int Saig_ManAddUniqueness
              (sat_solver *pSat,Vec_Int_t *vState,int nRegs,int i,int k,int *pnSatVarNum,
              int *pnClauses,int fVerbose)

{
  int iVar1;
  int iVarB;
  int iVarC;
  int *piVar2;
  uint __line;
  int iVar3;
  ulong uVar4;
  lit *begin;
  int iVar5;
  lit *end;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  
  if (((i < k) && (i != 0)) && (k != 0)) {
    iVar7 = k * nRegs;
    if (vState->nSize < iVar7) {
      pcVar6 = "nRegs * k <= Vec_IntSize(vState)";
      __line = 0x61;
    }
    else {
      piVar2 = vState->pArray;
      iVar5 = i * nRegs;
      uVar4 = 0;
      uVar8 = 0;
      if (0 < nRegs) {
        uVar8 = (ulong)(uint)nRegs;
      }
      for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
        if ((-1 < piVar2[(long)iVar5 + uVar4]) && (piVar2[(long)iVar7 + uVar4] == -1)) {
          iVar7 = 0;
          if (fVerbose == 0) {
            return 0;
          }
          pcVar6 = "Cannot constrain an incomplete state.";
          goto LAB_00517a43;
        }
      }
      iVar1 = *pnSatVarNum;
      for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
        if (-1 < piVar2[(long)iVar5 + uVar4]) {
          *pnClauses = *pnClauses + 4;
          iVar3 = piVar2[(long)iVar5 + uVar4];
          iVarB = piVar2[(long)iVar7 + uVar4];
          iVarC = *pnSatVarNum;
          *pnSatVarNum = iVarC + 1;
          iVar3 = Cnf_DataAddXorClause(pSat,iVar3,iVarB,iVarC);
          if (iVar3 == 0) {
            if (fVerbose == 0) {
              return 1;
            }
            goto LAB_00517a3c;
          }
        }
      }
      *pnClauses = *pnClauses + 1;
      begin = (lit *)malloc((long)nRegs << 2);
      iVar5 = *pnSatVarNum;
      iVar7 = iVar1 * 2;
      end = begin;
      for (iVar3 = 0; iVar3 + iVar1 < iVar5; iVar3 = iVar3 + 1) {
        *end = iVar7;
        end = end + 1;
        iVar7 = iVar7 + 2;
      }
      if (iVar3 <= nRegs) {
        iVar5 = sat_solver_addclause(pSat,begin,end);
        free(begin);
        iVar7 = 0;
        if ((iVar5 == 0) && (iVar7 = 1, fVerbose != 0)) {
LAB_00517a3c:
          iVar7 = 1;
          pcVar6 = "SAT solver became UNSAT after adding a uniqueness constraint.";
LAB_00517a43:
          puts(pcVar6);
        }
        return iVar7;
      }
      pcVar6 = "iVars <= nRegs";
      __line = 0x7e;
    }
  }
  else {
    pcVar6 = "i && k && i < k";
    __line = 0x60;
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigInd.c"
                ,__line,
                "int Saig_ManAddUniqueness(sat_solver *, Vec_Int_t *, int, int, int, int *, int *, int)"
               );
}

Assistant:

int Saig_ManAddUniqueness( sat_solver * pSat, Vec_Int_t * vState, int nRegs, int i, int k, int * pnSatVarNum, int * pnClauses, int fVerbose )
{
    int * pStateI = (int *)Vec_IntArray(vState) + nRegs * i;
    int * pStateK = (int *)Vec_IntArray(vState) + nRegs * k;
    int v, iVars, nSatVarsOld, RetValue, * pClause;
    assert( i && k && i < k );
    assert( nRegs * k <= Vec_IntSize(vState) );
    // check if the states are available
    for ( v = 0; v < nRegs; v++ )
        if ( pStateI[v] >= 0 && pStateK[v] == -1 )
        {
            if ( fVerbose )
                printf( "Cannot constrain an incomplete state.\n" );
            return 0;
        }
    // add XORs
    nSatVarsOld = *pnSatVarNum;
    for ( v = 0; v < nRegs; v++ )
        if ( pStateI[v] >= 0 )
        {
            *pnClauses += 4;
            RetValue = Cnf_DataAddXorClause( pSat, pStateI[v], pStateK[v], (*pnSatVarNum)++ );
            if ( RetValue == 0 )
            {
                if ( fVerbose )
                    printf( "SAT solver became UNSAT after adding a uniqueness constraint.\n" );
                return 1;
            }
        }
    // add OR clause
    (*pnClauses)++;
    iVars = 0;
    pClause = ABC_ALLOC( int, nRegs );
    for ( v = nSatVarsOld; v < *pnSatVarNum; v++ )
        pClause[iVars++] = toLitCond( v, 0 );
    assert( iVars <= nRegs );
    RetValue = sat_solver_addclause( pSat, pClause, pClause + iVars );
    ABC_FREE( pClause );
    if ( RetValue == 0 )
    {
        if ( fVerbose )
            printf( "SAT solver became UNSAT after adding a uniqueness constraint.\n" );
        return 1;
    }
    return 0;
}